

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

float compare(vector<float,_std::allocator<float>_> *fv1,vector<float,_std::allocator<float>_> *fv2)

{
  float fVar1;
  size_type sVar2;
  reference pvVar3;
  __type _Var4;
  double dVar5;
  double dVar6;
  float dist;
  float similary;
  float norm;
  int i;
  float sum3;
  float sum2;
  float dot;
  vector<float,_std::allocator<float>_> *fv2_local;
  vector<float,_std::allocator<float>_> *fv1_local;
  
  sum3 = 0.0;
  i = 0;
  norm = 0.0;
  similary = 0.0;
  while( true ) {
    sVar2 = std::vector<float,_std::allocator<float>_>::size(fv1);
    if (sVar2 <= (ulong)(long)(int)similary) break;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](fv1,(long)(int)similary);
    fVar1 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](fv2,(long)(int)similary);
    sum3 = fVar1 * *pvVar3 + sum3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](fv1,(long)(int)similary);
    _Var4 = std::pow<float,int>(*pvVar3,2);
    i = (int)(float)((double)(float)i + _Var4);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](fv2,(long)(int)similary);
    _Var4 = std::pow<float,int>(*pvVar3,2);
    norm = (float)((double)norm + _Var4);
    similary = (float)((int)similary + 1);
  }
  dVar5 = std::sqrt((double)(ulong)(uint)i);
  dVar6 = std::sqrt((double)(ulong)(uint)norm);
  dVar5 = std::acos((double)(ulong)(uint)(sum3 / (SUB84(dVar5,0) * SUB84(dVar6,0))));
  return SUB84(dVar5,0) / 3.1415927;
}

Assistant:

float compare(vector<float> &fv1, vector<float> &fv2){
    float dot = 0;
    float sum2 = 0;
    float sum3 = 0;
    for(int i = 0; i < fv1.size(); i++){
        dot += fv1[i]*fv2[i];
        sum2 += pow(fv1[i], 2);
        sum3 += pow(fv2[i], 2);
    }
    float norm = sqrt(sum2)*sqrt(sum3);
    float similary = dot / norm;
    float dist = acos(similary) / CV_PI;
    return dist;
}